

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Value * __thiscall
soul::heart::Parser::parseConstant
          (Value *__return_storage_ptr__,Parser *this,Type *requiredType,bool throwOnError)

{
  uint64_t *this_00;
  int64_t v;
  ulong uVar1;
  uint64_t this_01;
  bool bVar2;
  ArraySize AVar3;
  size_t sVar4;
  Type *pTVar5;
  StringDictionary *pSVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Value *in_R8;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> members;
  string local_780;
  CompileMessage local_760;
  undefined1 local_728 [16];
  uint32_t local_714;
  char *local_710;
  string local_708 [8];
  string n;
  Type local_6a8;
  undefined1 local_690 [8];
  Value singleValue;
  int64_t val_4;
  char *local_5c0;
  int64_t local_5b8;
  int64_t val_3;
  char *local_570;
  double local_568;
  double val_2;
  Value infOrNaN_1;
  Value local_510;
  char *local_4d0;
  double local_4c8;
  double val_1;
  undefined1 local_4b8 [8];
  Value infOrNaN;
  Value local_468;
  CompileMessage local_428;
  int64_t local_3f0;
  int64_t val;
  char *local_3a8;
  ArrayView<soul::Value> local_3a0;
  char *local_390;
  char *local_388;
  Value local_380;
  ulong local_340;
  size_t i;
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  Structure *s;
  vector<soul::Value,_std::allocator<soul::Value>_> local_100;
  ArrayView<soul::Value> local_e8;
  undefined1 local_d8 [28];
  undefined1 local_bc [28];
  vector<soul::Value,_std::allocator<soul::Value>_> local_a0;
  ArrayView<soul::Value> local_88;
  undefined1 local_78 [64];
  char *local_38;
  char *local_30;
  byte local_21;
  Type *pTStack_20;
  bool throwOnError_local;
  Type *requiredType_local;
  Parser *this_local;
  
  local_30 = "{";
  local_21 = throwOnError;
  pTStack_20 = requiredType;
  requiredType_local = (Type *)this;
  this_local = (Parser *)__return_storage_ptr__;
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)"{");
  if (bVar2) {
    local_38 = "}";
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x4ad7e6);
    if (bVar2) {
      Type::Type((Type *)(local_78 + 0x28),pTStack_20);
      soul::Value::zeroInitialiser(__return_storage_ptr__,(Type *)(local_78 + 0x28));
      Type::~Type((Type *)(local_78 + 0x28));
      return __return_storage_ptr__;
    }
    bVar2 = Type::isVector(pTStack_20);
    if (bVar2) {
      Type::Type((Type *)local_78,pTStack_20);
      Type::getVectorElementType((Type *)local_bc);
      Type::Type((Type *)(local_bc + 4),(PrimitiveType *)local_bc);
      AVar3 = Type::getVectorSize(pTStack_20);
      parseConstantList(&local_a0,this,(Type *)(local_bc + 4),AVar3);
      ArrayView<soul::Value>::ArrayView<std::vector<soul::Value,std::allocator<soul::Value>>>
                (&local_88,&local_a0);
      elements.e = in_R8;
      elements.s = local_88.e;
      soul::Value::createArrayOrVector
                (__return_storage_ptr__,(Value *)local_78,&(local_88.s)->type,elements);
      std::vector<soul::Value,_std::allocator<soul::Value>_>::~vector(&local_a0);
      Type::~Type((Type *)(local_bc + 4));
      Type::~Type((Type *)local_78);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isArray(pTStack_20);
    if (bVar2) {
      Type::Type((Type *)local_d8,pTStack_20);
      Type::getArrayElementType((Type *)&s,pTStack_20);
      AVar3 = Type::getArraySize(pTStack_20);
      parseConstantList(&local_100,this,(Type *)&s,AVar3);
      ArrayView<soul::Value>::ArrayView<std::vector<soul::Value,std::allocator<soul::Value>>>
                (&local_e8,&local_100);
      elements_00.e = in_R8;
      elements_00.s = local_e8.e;
      soul::Value::createArrayOrVector
                (__return_storage_ptr__,(Value *)local_d8,&(local_e8.s)->type,elements_00);
      std::vector<soul::Value,_std::allocator<soul::Value>_>::~vector(&local_100);
      Type::~Type((Type *)&s);
      Type::~Type((Type *)local_d8);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isStruct(pTStack_20);
    if (bVar2) {
      memberValues.space[0x3f] = (uint64_t)Type::getStructRef(pTStack_20);
      ArrayWithPreallocation<soul::Value,_8UL>::ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Value,_8UL> *)&i);
      sVar4 = Structure::getNumMembers((Structure *)memberValues.space[0x3f]);
      ArrayWithPreallocation<soul::Value,_8UL>::reserve
                ((ArrayWithPreallocation<soul::Value,_8UL> *)&i,sVar4);
      for (local_340 = 0; uVar1 = local_340,
          sVar4 = Structure::getNumMembers((Structure *)memberValues.space[0x3f]),
          this_01 = memberValues.space[0x3f], uVar1 < sVar4; local_340 = local_340 + 1) {
        pTVar5 = Structure::getMemberType((Structure *)memberValues.space[0x3f],local_340);
        parseConstant(&local_380,this,pTVar5,true);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)&i,&local_380);
        soul::Value::~Value(&local_380);
        uVar1 = local_340;
        sVar4 = Structure::getNumMembers((Structure *)memberValues.space[0x3f]);
        if (uVar1 == sVar4 - 1) {
          local_388 = "}";
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4ad7e6);
        }
        else {
          local_390 = ",";
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)",");
        }
      }
      ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,8ul>>
                (&local_3a0,(ArrayWithPreallocation<soul::Value,_8UL> *)&i);
      members.e = in_R8;
      members.s = local_3a0.e;
      soul::Value::createStruct
                (__return_storage_ptr__,(Value *)this_01,(Structure *)local_3a0.s,members);
      ArrayWithPreallocation<soul::Value,_8UL>::~ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Value,_8UL> *)&i);
      return __return_storage_ptr__;
    }
  }
  local_3a8 = "-";
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4cfab9);
  if (bVar2) {
    parseConstant((Value *)&val,this,pTStack_20,(bool)(local_21 & 1));
    negate(__return_storage_ptr__,this,(Value *)&val);
    soul::Value::~Value((Value *)&val);
    return __return_storage_ptr__;
  }
  bVar2 = Type::isBoundedInt(pTStack_20);
  if (bVar2) {
    local_3f0 = parseLiteralInt(this);
    bVar2 = Type::isValidBoundedIntIndex<long>(pTStack_20,local_3f0);
    if (!bVar2) {
      Errors::indexOutOfRange<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_428);
      CompileMessage::~CompileMessage(&local_428);
    }
    soul::Value::Value(&local_468,local_3f0);
    castValue(__return_storage_ptr__,this,&local_468,pTStack_20);
    soul::Value::~Value(&local_468);
    return __return_storage_ptr__;
  }
  bVar2 = Type::isPrimitive(pTStack_20);
  if (!bVar2) {
LAB_00433f57:
    bVar2 = Type::isArrayOrVector(pTStack_20);
    if (bVar2) {
      Type::getElementType(&local_6a8,pTStack_20);
      parseConstant((Value *)local_690,this,&local_6a8,false);
      Type::~Type(&local_6a8);
      soul::Value::Value((Value *)((long)&n.field_2 + 8));
      bVar2 = soul::Value::operator!=((Value *)local_690,(Value *)((long)&n.field_2 + 8));
      soul::Value::~Value((Value *)((long)&n.field_2 + 8));
      if (bVar2) {
        castValue(__return_storage_ptr__,this,(Value *)local_690,pTStack_20);
      }
      val_1._4_4_ = (uint)bVar2;
      soul::Value::~Value((Value *)local_690);
      if (val_1._4_4_ != 0) {
        return __return_storage_ptr__;
      }
    }
    bVar2 = Type::isStringLiteral(pTStack_20);
    if (!bVar2) {
      if ((local_21 & 1) != 0) {
        getTypeDescription_abi_cxx11_(&local_780,this,pTStack_20);
        Errors::expectedExpressionOfType<std::__cxx11::string>(&local_760,(Errors *)&local_780,args)
        ;
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_760);
        CompileMessage::~CompileMessage(&local_760);
        std::__cxx11::string::~string((string *)&local_780);
      }
      soul::Value::Value(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              (local_708,
               (string *)
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).currentStringValue);
    local_710 = "$string literal";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)"$string literal");
    pSVar6 = Program::getStringDictionary(&this->program);
    local_728 = std::__cxx11::string::operator_cast_to_basic_string_view(local_708);
    local_714 = (*(pSVar6->super_StringDictionary)._vptr_StringDictionary[2])
                          (pSVar6,local_728._0_8_,local_728._8_8_);
    soul::Value::createStringLiteral(__return_storage_ptr__,(Handle)local_714);
    val_1._4_4_ = 1;
    std::__cxx11::string::~string(local_708);
    return __return_storage_ptr__;
  }
  bVar2 = Type::isFloat64(pTStack_20);
  if (!bVar2) {
    bVar2 = Type::isFloat32(pTStack_20);
    if (!bVar2) {
      bVar2 = Type::isInteger32(pTStack_20);
      if (bVar2) {
        local_5b8 = (this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).literalIntValue;
        local_5c0 = "$integer32";
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)"$integer32");
        soul::Value::Value((Value *)&val_4,local_5b8);
        castValue(__return_storage_ptr__,this,(Value *)&val_4,pTStack_20);
        soul::Value::~Value((Value *)&val_4);
        return __return_storage_ptr__;
      }
      bVar2 = Type::isInteger64(pTStack_20);
      if (bVar2) {
        v = (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).literalIntValue;
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)"$integer64");
        this_00 = singleValue.allocatedData.allocatedData.space;
        soul::Value::Value((Value *)this_00,v);
        castValue(__return_storage_ptr__,this,(Value *)this_00,pTStack_20);
        soul::Value::~Value((Value *)singleValue.allocatedData.allocatedData.space);
        return __return_storage_ptr__;
      }
      bVar2 = Type::isBool(pTStack_20);
      if (bVar2) {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,"true");
        if (bVar2) {
          soul::Value::Value(__return_storage_ptr__,true);
          return __return_storage_ptr__;
        }
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,"false");
        if (bVar2) {
          soul::Value::Value(__return_storage_ptr__,false);
          return __return_storage_ptr__;
        }
      }
      goto LAB_00433f57;
    }
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)"$integer32");
    if (bVar2) {
LAB_00433c3c:
      soul::Value::Value(__return_storage_ptr__,
                         (float)(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).literalIntValue);
      return __return_storage_ptr__;
    }
    infOrNaN_1.allocatedData.allocatedData.space[0] = (uint64_t)anon_var_dwarf_d4668;
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)"$integer64");
    if (bVar2) goto LAB_00433c3c;
    parseNaNandInfinityTokens((Value *)&val_2,this);
    bVar2 = soul::Value::isValid((Value *)&val_2);
    if (bVar2) {
      pTVar5 = soul::Value::getType((Value *)&val_2);
      bVar2 = Type::isFloat32(pTVar5);
      if (bVar2) {
        soul::Value::Value(__return_storage_ptr__,(Value *)&val_2);
        goto LAB_00433d7b;
      }
    }
    local_568 = (this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).literalDoubleValue;
    local_570 = "$float32";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)"$float32");
    soul::Value::Value((Value *)&val_3,local_568);
    castValue(__return_storage_ptr__,this,(Value *)&val_3,pTStack_20);
    soul::Value::~Value((Value *)&val_3);
LAB_00433d7b:
    val_1._4_4_ = 1;
    soul::Value::~Value((Value *)&val_2);
    return __return_storage_ptr__;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)"$integer32");
  if (bVar2) {
LAB_00433a7d:
    soul::Value::Value(__return_storage_ptr__,
                       (double)(this->
                               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ).literalIntValue);
    return __return_storage_ptr__;
  }
  infOrNaN.allocatedData.allocatedData.space[0] = (uint64_t)anon_var_dwarf_d4668;
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)"$integer64");
  if (bVar2) goto LAB_00433a7d;
  parseNaNandInfinityTokens((Value *)local_4b8,this);
  bVar2 = soul::Value::isValid((Value *)local_4b8);
  if (bVar2) {
    pTVar5 = soul::Value::getType((Value *)local_4b8);
    bVar2 = Type::isFloat64(pTVar5);
    if (bVar2) {
      soul::Value::Value(__return_storage_ptr__,(Value *)local_4b8);
      goto LAB_00433bbc;
    }
  }
  local_4c8 = (this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).literalDoubleValue;
  local_4d0 = "$float64";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)"$float64");
  soul::Value::Value(&local_510,local_4c8);
  castValue(__return_storage_ptr__,this,&local_510,pTStack_20);
  soul::Value::~Value(&local_510);
LAB_00433bbc:
  val_1._4_4_ = 1;
  soul::Value::~Value((Value *)local_4b8);
  return __return_storage_ptr__;
}

Assistant:

Value parseConstant (const Type& requiredType, bool throwOnError)
    {
        if (matchIf (HEARTOperator::openBrace))
        {
            if (matchIf (HEARTOperator::closeBrace))
                return Value::zeroInitialiser (requiredType);

            if (requiredType.isVector())
                return Value::createArrayOrVector (requiredType,
                                                   parseConstantList (requiredType.getVectorElementType(),
                                                                      requiredType.getVectorSize()));

            if (requiredType.isArray())
                return Value::createArrayOrVector (requiredType,
                                                   parseConstantList (requiredType.getArrayElementType(),
                                                                      requiredType.getArraySize()));

            if (requiredType.isStruct())
            {
                auto& s = requiredType.getStructRef();
                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < s.getNumMembers(); ++i)
                {
                    memberValues.push_back (parseConstant (s.getMemberType (i), true));

                    if (i == s.getNumMembers() - 1)
                        expect (HEARTOperator::closeBrace);
                    else
                        expect (HEARTOperator::comma);
                }

                return Value::createStruct (s, memberValues);
            }
        }

        if (matchIf (HEARTOperator::minus))
            return negate (parseConstant (requiredType, throwOnError));

        if (requiredType.isBoundedInt())
        {
            auto val = parseLiteralInt();

            if (! requiredType.isValidBoundedIntIndex (val))
                throwError (Errors::indexOutOfRange());

            return castValue (Value (val), requiredType);
        }

        if (requiredType.isPrimitive())
        {
            if (requiredType.isFloat64())
            {
                if (matchIf (Token::literalInt32) || matchIf (Token::literalInt64))
                    return Value ((double) literalIntValue);

                auto infOrNaN = parseNaNandInfinityTokens();

                if (infOrNaN.isValid() && infOrNaN.getType().isFloat64())
                    return infOrNaN;

                auto val = literalDoubleValue;
                expect (Token::literalFloat64);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isFloat32())
            {
                if (matchIf (Token::literalInt32) || matchIf (Token::literalInt64))
                    return Value ((float) literalIntValue);

                auto infOrNaN = parseNaNandInfinityTokens();

                if (infOrNaN.isValid() && infOrNaN.getType().isFloat32())
                    return infOrNaN;

                auto val = literalDoubleValue;
                expect (Token::literalFloat32);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isInteger32())
            {
                auto val = literalIntValue;
                expect (Token::literalInt32);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isInteger64())
            {
                auto val = literalIntValue;
                expect (Token::literalInt64);
                return castValue (Value (val), requiredType);
            }

            if (requiredType.isBool())
            {
                if (matchIf ("true"))  return Value (true);
                if (matchIf ("false")) return Value (false);
            }
        }

        if (requiredType.isArrayOrVector())
        {
            auto singleValue = parseConstant (requiredType.getElementType(), false);

            if (singleValue != Value())
                return castValue (singleValue, requiredType);
        }

        if (requiredType.isStringLiteral())
        {
            auto n = currentStringValue;
            expect (Token::literalString);
            return Value::createStringLiteral (program.getStringDictionary().getHandleForString (n));
        }

        if (throwOnError)
            throwError (Errors::expectedExpressionOfType (getTypeDescription (requiredType)));

        return {};
    }